

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

Type wasm::Type::get(uint byteSize,bool float_)

{
  Type TVar1;
  
  TVar1.id = 2;
  if (3 < byteSize) {
    if (byteSize == 0x10) {
      return (Type)6;
    }
    if (byteSize != 8) {
      if (byteSize == 4) {
        return (Type)((ulong)float_ * 2 + 2);
      }
      handle_unreachable("invalid size",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                         ,0x2e9);
    }
    TVar1.id = (ulong)float_ * 2 + 3;
  }
  return (Type)TVar1.id;
}

Assistant:

Type Type::get(unsigned byteSize, bool float_) {
  if (byteSize < 4) {
    return Type::i32;
  }
  if (byteSize == 4) {
    return float_ ? Type::f32 : Type::i32;
  }
  if (byteSize == 8) {
    return float_ ? Type::f64 : Type::i64;
  }
  if (byteSize == 16) {
    return Type::v128;
  }
  WASM_UNREACHABLE("invalid size");
}